

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall cppjieba::DictTrie::LoadUserDict(DictTrie *this,string *filePaths)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string line;
  ifstream ifs;
  
  std::__cxx11::string::string((string *)&ifs,"|;",(allocator *)&line);
  limonp::Split(&files,filePaths,(string *)&ifs,0xffffffffffffffff);
  std::__cxx11::string::~string((string *)&ifs);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    std::ifstream::ifstream
              ((string *)&ifs,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      limonp::Logger::Logger
                ((Logger *)&line,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]cppjieba/include/cppjieba/DictTrie.hpp"
                 ,0x98);
      poVar2 = std::operator<<((ostream *)&line,"exp: [ifs.is_open()");
      poVar2 = std::operator<<(poVar2,"] false. ");
      poVar2 = std::operator<<(poVar2,"open ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      (files.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar4));
      std::operator<<(poVar2," failed");
      limonp::Logger::~Logger((Logger *)&line);
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifs,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        InserUserDictNode(this,&line);
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream((string *)&ifs);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return;
}

Assistant:

void LoadUserDict(const std::string& filePaths) {
    std::vector<std::string> files = limonp::Split(filePaths, "|;");
    for (size_t i = 0; i < files.size(); i++) {
      std::ifstream ifs(files[i].c_str());
      XCHECK(ifs.is_open()) << "open " << files[i] << " failed";
      std::string line;

      while(getline(ifs, line)) {
        if (line.size() == 0) {
          continue;
        }
        InserUserDictNode(line);
      }
    }
  }